

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

BufferGLImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::BufferGLImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::BufferGLImpl,Diligent::FixedBlockMemoryAllocator> *this,
          FixedBlockMemoryAllocator *CtorArgs,RenderDeviceGLImpl **CtorArgs_1,BufferDesc *CtorArgs_2
          ,reference_wrapper<Diligent::GLContextState> *CtorArgs_3,BufferData **CtorArgs_4,
          bool *CtorArgs_5)

{
  RenderDeviceGLImpl *pRVar1;
  GLContextState *pGVar2;
  FixedBlockMemoryAllocator *pFVar3;
  BufferGLImpl *local_50;
  BufferGLImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  BufferData **CtorArgs_local_4;
  reference_wrapper<Diligent::GLContextState> *CtorArgs_local_3;
  BufferDesc *CtorArgs_local_2;
  RenderDeviceGLImpl **CtorArgs_local_1;
  FixedBlockMemoryAllocator *CtorArgs_local;
  MakeNewRCObj<Diligent::BufferGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pFVar3 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (BufferGLImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (BufferGLImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_50 = (BufferGLImpl *)
               RefCountedObject<Diligent::IBufferGL>::operator_new
                         ((RefCountedObject<Diligent::IBufferGL> *)0xa0,(size_t)pFVar3);
    pRVar1 = *CtorArgs_1;
    pGVar2 = std::reference_wrapper::operator_cast_to_GLContextState_
                       ((reference_wrapper *)CtorArgs_3);
    BufferGLImpl::BufferGLImpl
              (local_50,(IReferenceCounters *)pObj,CtorArgs,pRVar1,CtorArgs_2,pGVar2,*CtorArgs_4,
               (bool)(*CtorArgs_5 & 1));
  }
  else {
    local_50 = (BufferGLImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0xa0,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    pRVar1 = *CtorArgs_1;
    pGVar2 = std::reference_wrapper::operator_cast_to_GLContextState_
                       ((reference_wrapper *)CtorArgs_3);
    BufferGLImpl::BufferGLImpl
              (local_50,(IReferenceCounters *)pObj,CtorArgs,pRVar1,CtorArgs_2,pGVar2,*CtorArgs_4,
               (bool)(*CtorArgs_5 & 1));
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::BufferGLImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_50,*(FixedBlockMemoryAllocator **)this);
  }
  return local_50;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }